

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall QGraphicsOpacityEffect::setOpacityMask(QGraphicsOpacityEffect *this,QBrush *mask)

{
  long lVar1;
  char cVar2;
  
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  cVar2 = QBrush::operator==((QBrush *)(lVar1 + 0xb0),mask);
  if (cVar2 != '\0') {
    return;
  }
  QBrush::operator=((QBrush *)(lVar1 + 0xb0),mask);
  *(byte *)(lVar1 + 0xb8) = *(byte *)(lVar1 + 0xb8) & 0xfb | (*(int *)(*(long *)mask + 4) != 0) << 2
  ;
  QGraphicsEffect::update(&this->super_QGraphicsEffect);
  opacityMaskChanged(this,mask);
  return;
}

Assistant:

void QGraphicsOpacityEffect::setOpacityMask(const QBrush &mask)
{
    Q_D(QGraphicsOpacityEffect);
    if (d->opacityMask == mask)
        return;

    d->opacityMask = mask;
    d->hasOpacityMask = (mask.style() != Qt::NoBrush);
    update();

    emit opacityMaskChanged(mask);
}